

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextodfwriter.cpp
# Opt level: O1

void __thiscall
QTextOdfWriter::writeTableFormat
          (QTextOdfWriter *this,QXmlStreamWriter *writer,QTextTableFormat format,int formatIndex)

{
  char *pcVar1;
  char16_t *pcVar2;
  Data<QHashPrivate::Node<int,_QHashDummyValue>_> *this_00;
  ulong uVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  char16_t *pcVar9;
  qsizetype qVar10;
  Data *pDVar11;
  int iVar12;
  Node<int,_QHashDummyValue> *pNVar13;
  QSharedDataPointer<QTextFormatPrivate> this_01;
  storage_type *psVar14;
  size_t sVar15;
  char *pcVar16;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar17;
  long lVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  QByteArrayView QVar20;
  QAnyStringView QVar21;
  QByteArrayView QVar22;
  QByteArrayView QVar23;
  QByteArrayView QVar24;
  QByteArrayView QVar25;
  QAnyStringView QVar26;
  QByteArrayView QVar27;
  QAnyStringView QVar28;
  QByteArrayView QVar29;
  QByteArrayView QVar30;
  QAnyStringView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QAnyStringView QVar36;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QAnyStringView QVar39;
  QByteArrayView QVar40;
  QByteArrayView QVar41;
  QAnyStringView QVar42;
  QByteArrayView QVar43;
  QAnyStringView QVar44;
  QByteArrayView QVar45;
  QAnyStringView QVar46;
  QAnyStringView QVar47;
  QAnyStringView QVar48;
  QAnyStringView QVar49;
  QAnyStringView QVar50;
  QAnyStringView QVar51;
  QAnyStringView QVar52;
  QAnyStringView QVar53;
  QAnyStringView QVar54;
  QAnyStringView QVar55;
  QAnyStringView QVar56;
  QAnyStringView QVar57;
  QAnyStringView QVar58;
  QAnyStringView QVar59;
  QAnyStringView QVar60;
  QAnyStringView QVar61;
  QAnyStringView QVar62;
  QAnyStringView QVar63;
  QAnyStringView QVar64;
  QAnyStringView QVar65;
  QAnyStringView QVar66;
  QTextLength QVar67;
  int copy;
  QList<QTextLength> local_118;
  QStringBuilder<QString,_QLatin1String> local_f8;
  QAnyStringView local_c8;
  char16_t *local_b8;
  ulong uStack_b0;
  char16_t *local_a8;
  ulong uStack_a0;
  char16_t *local_98;
  ulong uStack_90;
  QArrayData *local_88;
  char16_t *pcStack_80;
  ulong local_78;
  QString local_68;
  char16_t *local_50;
  ulong uStack_48;
  qint32 local_3c;
  long local_38;
  
  this_01.d.ptr = format.super_QTextFrameFormat.super_QTextFormat.d.d.ptr;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c = format.super_QTextFrameFormat.super_QTextFormat.format_type;
  pcVar2 = (this->styleNS).d.ptr;
  uVar19 = (this->styleNS).d.size;
  QVar20.m_data = &DAT_00000005;
  QVar20.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar20);
  QVar21.m_size = (size_t)pcVar2;
  QVar21.field_0.m_data_utf8 = (char *)writer;
  QVar47.m_size = (size_t)local_f8.a.d.ptr;
  QVar47.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
  QXmlStreamWriter::writeStartElement(QVar21,QVar47);
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar19 = (this->styleNS).d.size;
  QVar22.m_data = (storage_type *)0x4;
  QVar22.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar22);
  pcVar9 = local_f8.a.d.ptr;
  aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
  QVar23.m_data = (storage_type *)0x7;
  QVar23.m_size = (qsizetype)&local_88;
  QString::fromLatin1(QVar23);
  sVar15 = 0x20;
  QString::arg_impl((longlong)&local_68,(int)&local_88,local_3c,(QChar)0x0);
  local_50 = local_68.d.ptr;
  uStack_48 = local_68.d.size | 0x8000000000000000;
  QVar6.m_size = (size_t)pcVar2;
  QVar6.field_0.m_data_utf8 = (char *)writer;
  QVar48.m_size = (size_t)pcVar9;
  QVar48.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
  QVar59.m_size = sVar15;
  QVar59.field_0.m_data = aVar17.m_data;
  QXmlStreamWriter::writeAttribute(QVar6,QVar48,QVar59);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_88 != (QArrayData *)0x0) {
    LOCK();
    (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_88,2,0x10);
    }
  }
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar19 = (this->styleNS).d.size;
  QVar24.m_data = &DAT_00000006;
  QVar24.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar24);
  pcVar9 = local_f8.a.d.ptr;
  aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
  QVar25.m_data = &DAT_00000005;
  QVar25.m_size = (qsizetype)&local_68;
  QString::fromLatin1(QVar25);
  local_98 = local_68.d.ptr;
  uStack_90 = local_68.d.size | 0x8000000000000000;
  QVar26.m_size = (size_t)pcVar2;
  QVar26.field_0.m_data_utf8 = (char *)writer;
  QVar49.m_size = (size_t)pcVar9;
  QVar49.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
  QVar60.m_size = sVar15;
  QVar60.field_0.m_data = aVar17.m_data;
  QXmlStreamWriter::writeAttribute(QVar26,QVar49,QVar60);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  pcVar2 = (this->styleNS).d.ptr;
  uVar19 = (this->styleNS).d.size;
  QVar27.m_data = (storage_type *)0x10;
  QVar27.m_size = (qsizetype)&local_f8;
  QString::fromLatin1(QVar27);
  QVar28.m_size = (size_t)pcVar2;
  QVar28.field_0.m_data_utf8 = (char *)writer;
  QVar50.m_size = (size_t)local_f8.a.d.ptr;
  QVar50.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
  QXmlStreamWriter::writeEmptyElement(QVar28,QVar50);
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
    }
  }
  this_00 = (this->m_tableFormatsWithBorders).q_hash.d;
  if ((this_00 != (Data<QHashPrivate::Node<int,_QHashDummyValue>_> *)0x0) &&
     (pNVar13 = QHashPrivate::Data<QHashPrivate::Node<int,_QHashDummyValue>_>::findNode<int>
                          (this_00,&local_3c), pNVar13 != (Node<int,_QHashDummyValue> *)0x0)) {
    pcVar2 = (this->tableNS).d.ptr;
    uVar19 = (this->tableNS).d.size;
    QVar29.m_data = (storage_type *)0xc;
    QVar29.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar29);
    pcVar9 = local_f8.a.d.ptr;
    aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
    QVar30.m_data = (storage_type *)0xa;
    QVar30.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar30);
    local_a8 = local_68.d.ptr;
    uStack_a0 = local_68.d.size | 0x8000000000000000;
    QVar31.m_size = (size_t)pcVar2;
    QVar31.field_0.m_data_utf8 = (char *)writer;
    QVar51.m_size = (size_t)pcVar9;
    QVar51.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
    QVar61.m_size = sVar15;
    QVar61.field_0.m_data = aVar17.m_data;
    QXmlStreamWriter::writeAttribute(QVar31,QVar51,QVar61);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  iVar12 = QTextFormat::intProperty((QTextFormat *)this_01.d.ptr,0x1010);
  bVar5 = true;
  pcVar16 = (char *)0x0;
  switch(iVar12) {
  case 1:
    pcVar16 = "left";
    break;
  case 2:
    pcVar16 = "right";
    break;
  default:
    goto switchD_005c8340_caseD_3;
  case 4:
    pcVar16 = "center";
    break;
  case 8:
    pcVar16 = "margins";
  }
  bVar5 = false;
switchD_005c8340_caseD_3:
  if (!bVar5) {
    pcVar2 = (this->tableNS).d.ptr;
    uVar19 = (this->tableNS).d.size;
    QVar32.m_data = &DAT_00000005;
    QVar32.m_size = (qsizetype)&local_f8;
    QString::fromLatin1(QVar32);
    pcVar9 = local_f8.a.d.ptr;
    psVar14 = (storage_type *)0xffffffffffffffff;
    do {
      pcVar1 = psVar14 + (long)(pcVar16 + 1);
      psVar14 = psVar14 + 1;
    } while (*pcVar1 != '\0');
    aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
    QVar33.m_data = psVar14;
    QVar33.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar33);
    local_b8 = local_68.d.ptr;
    uStack_b0 = local_68.d.size | 0x8000000000000000;
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data_utf8 = (char *)writer;
    QVar52.m_size = (size_t)pcVar9;
    QVar52.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
    QVar62.m_size = sVar15;
    QVar62.field_0.m_data = aVar17.m_data;
    QXmlStreamWriter::writeAttribute(QVar7,QVar52,QVar62);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QVar67 = QTextFormat::lengthProperty((QTextFormat *)this_01.d.ptr,0x4003);
  if ((QVar67.fixedValueOrPercentage != 0.0) || (NAN(QVar67.fixedValueOrPercentage))) {
    pcVar2 = (this->styleNS).d.ptr;
    uVar19 = (this->styleNS).d.size;
    QVar34.m_data = &DAT_00000005;
    QVar34.m_size = (qsizetype)&local_68;
    QString::fromLatin1(QVar34);
    pcVar9 = local_68.d.ptr;
    aVar17.m_data = (void *)(local_68.d.size | 0x8000000000000000);
    QVar67 = QTextFormat::lengthProperty((QTextFormat *)this_01.d.ptr,0x4003);
    QString::number(QVar67.fixedValueOrPercentage,(char)&local_88,0x67);
    local_f8.a.d.size = local_78;
    local_f8.a.d.ptr = pcStack_80;
    local_f8.a.d.d = (Data *)local_88;
    local_88 = (QArrayData *)0x0;
    pcStack_80 = (char16_t *)0x0;
    local_78 = 0;
    local_f8.b.m_size = 2;
    local_f8.b.m_data = "pt";
    local_118.d.size = 0;
    local_118.d.d = (Data *)0x0;
    local_118.d.ptr = (QTextLength *)0x0;
    QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
              (&local_c8,&local_f8,
               (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)&local_118);
    QVar8.m_size = (size_t)pcVar2;
    QVar8.field_0.m_data_utf8 = (char *)writer;
    QVar53.m_size = (size_t)pcVar9;
    QVar53.field_0.m_data = (void *)(uVar19 | 0x8000000000000000);
    QVar63.m_size = sVar15;
    QVar63.field_0.m_data = aVar17.m_data;
    QXmlStreamWriter::writeAttribute(QVar8,QVar53,QVar63);
    if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_88 != (QArrayData *)0x0) {
      LOCK();
      (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_88,2,0x10);
      }
    }
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QXmlStreamWriter::writeEndElement();
  QTextFormat::lengthVectorProperty
            ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
  qVar10 = local_f8.a.d.size;
  if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
    }
  }
  if (qVar10 != 0) {
    local_f8.a.d.d = (Data *)CONCAT44(local_f8.a.d.d._4_4_,local_3c);
    QHash<int,QHashDummyValue>::emplace<QHashDummyValue_const&>
              ((QHash<int,QHashDummyValue> *)&this->m_tableFormatsWithColWidthConstraints,
               (int *)&local_f8,(QHashDummyValue *)&local_68);
    lVar18 = 0;
    uVar19 = 0;
    while( true ) {
      QTextFormat::lengthVectorProperty
                ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
      qVar10 = local_f8.a.d.size;
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      if ((ulong)qVar10 <= uVar19) break;
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar35.m_data = &DAT_00000005;
      QVar35.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar35);
      QVar36.m_size = (size_t)pcVar2;
      QVar36.field_0.m_data_utf8 = (char *)writer;
      QVar54.m_size = (size_t)local_f8.a.d.ptr;
      QVar54.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeStartElement(QVar36,QVar54);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar37.m_data = (storage_type *)0x4;
      QVar37.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar37);
      pcVar9 = local_f8.a.d.ptr;
      aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar38.m_data = (storage_type *)0xa;
      QVar38.m_size = (qsizetype)&local_118;
      QString::fromLatin1(QVar38);
      QString::arg_impl((longlong)&local_88,(int)&local_118,local_3c,(QChar)0x0);
      sVar15 = 0x20;
      QString::arg_impl((longlong)&local_68,(int)&local_88,(int)uVar19,(QChar)0x0);
      QVar39.m_size = (size_t)pcVar2;
      QVar39.field_0.m_data_utf8 = (char *)writer;
      QVar55.m_size = (size_t)pcVar9;
      QVar55.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar64.m_size = sVar15;
      QVar64.field_0.m_data = aVar17.m_data;
      QXmlStreamWriter::writeAttribute(QVar39,QVar55,QVar64);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar40.m_data = &DAT_00000006;
      QVar40.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar40);
      pcVar9 = local_f8.a.d.ptr;
      aVar17.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar41.m_data = (storage_type *)0xc;
      QVar41.m_size = (qsizetype)&local_68;
      QString::fromLatin1(QVar41);
      QVar42.m_size = (size_t)pcVar2;
      QVar42.field_0.m_data_utf8 = (char *)writer;
      QVar56.m_size = (size_t)pcVar9;
      QVar56.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar65.m_size = sVar15;
      QVar65.field_0.m_data = aVar17.m_data;
      QXmlStreamWriter::writeAttribute(QVar42,QVar56,QVar65);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar43.m_data = (storage_type *)0x17;
      QVar43.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar43);
      QVar44.m_size = (size_t)pcVar2;
      QVar44.field_0.m_data_utf8 = (char *)writer;
      QVar57.m_size = (size_t)local_f8.a.d.ptr;
      QVar57.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QXmlStreamWriter::writeEmptyElement(QVar44,QVar57);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      QTextFormat::lengthVectorProperty
                ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
      iVar12 = *(int *)((long)local_f8.a.d.ptr + lVar18);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      if (iVar12 == 2) {
        QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
        QString::number(*(double *)((long)&(local_118.d.ptr)->fixedValueOrPercentage + lVar18),
                        (char)&local_88,0x67);
LAB_005c8be6:
        local_f8.a.d.d = (Data *)local_88;
        local_f8.a.d.ptr = pcStack_80;
        local_f8.a.d.size = local_78;
        local_f8.b.m_size = 1;
        local_f8.b.m_data = "%";
      }
      else {
        QTextFormat::lengthVectorProperty
                  ((QList<QTextLength> *)&local_f8,(QTextFormat *)this_01.d.ptr,0x4101);
        iVar12 = *(int *)((long)local_f8.a.d.ptr + lVar18);
        if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
          ;
          UNLOCK();
          if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,0x10,0x10);
          }
        }
        if (iVar12 != 1) {
          QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_118.d.size;
          QString::number((longlong)&local_88,SUB164((ZEXT816(0) << 0x40 | ZEXT816(100)) / auVar4,0)
                         );
          goto LAB_005c8be6;
        }
        QTextFormat::lengthVectorProperty(&local_118,(QTextFormat *)this_01.d.ptr,0x4101);
        QString::number(*(double *)((long)&(local_118.d.ptr)->fixedValueOrPercentage + lVar18),
                        (char)&local_88,0x67);
        local_f8.a.d.d = (Data *)local_88;
        local_f8.a.d.ptr = pcStack_80;
        local_f8.a.d.size = local_78;
        local_f8.b.m_size = 2;
        local_f8.b.m_data = "pt";
      }
      local_78 = 0;
      pcStack_80 = (char16_t *)0x0;
      local_88 = (QArrayData *)0x0;
      QStringBuilder<QString,_QLatin1String>::convertTo<QString>(&local_68,&local_f8);
      pDVar11 = local_68.d.d;
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (char16_t *)0x0;
      local_68.d.size = 0;
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      if (local_88 != (QArrayData *)0x0) {
        LOCK();
        (local_88->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_88->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_88->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_88,2,0x10);
        }
      }
      if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,0x10,0x10);
        }
      }
      pcVar2 = (this->styleNS).d.ptr;
      uVar3 = (this->styleNS).d.size;
      QVar45.m_data = (storage_type *)0xc;
      QVar45.m_size = (qsizetype)&local_f8;
      QString::fromLatin1(QVar45);
      QVar66.field_0.m_data = (void *)(local_f8.a.d.size | 0x8000000000000000);
      QVar46.m_size = (size_t)pcVar2;
      QVar46.field_0.m_data_utf8 = (char *)writer;
      QVar58.m_size = (size_t)local_f8.a.d.ptr;
      QVar58.field_0.m_data = (void *)(uVar3 | 0x8000000000000000);
      QVar66.m_size = sVar15;
      QXmlStreamWriter::writeAttribute(QVar46,QVar58,QVar66);
      if (&(local_f8.a.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_f8.a.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_f8.a.d.d)->super_QArrayData,2,0x10);
        }
      }
      QXmlStreamWriter::writeEndElement();
      if (&pDVar11->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar11->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar11->super_QArrayData,2,0x10);
        }
      }
      uVar19 = uVar19 + 1;
      lVar18 = lVar18 + 0x10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextOdfWriter::writeTableFormat(QXmlStreamWriter &writer, QTextTableFormat format, int formatIndex) const
{
    // start writing table style element
    writer.writeStartElement(styleNS, QString::fromLatin1("style"));
    writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                          QString::fromLatin1("Table%1").arg(formatIndex));
    writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table"));
    writer.writeEmptyElement(styleNS, QString::fromLatin1("table-properties"));

    if (m_tableFormatsWithBorders.contains(formatIndex)) {
        // write border format collapsing to table style
        writer.writeAttribute(tableNS, QString::fromLatin1("border-model"),
                              QString::fromLatin1("collapsing"));
    }
    const char* align = nullptr;
    switch (format.alignment()) {
    case Qt::AlignLeft:
        align = "left";
        break;
    case Qt::AlignRight:
        align = "right";
        break;
    case Qt::AlignHCenter:
        align = "center";
        break;
    case Qt::AlignJustify:
        align = "margins";
        break;
    }
    if (align)
       writer.writeAttribute(tableNS, QString::fromLatin1("align"), QString::fromLatin1(align));
    if (format.width().rawValue()) {
        writer.writeAttribute(styleNS, QString::fromLatin1("width"),
                              QString::number(format.width().rawValue()) + "pt"_L1);
    }
    writer.writeEndElement();
    // start writing table-column style element
    if (format.columnWidthConstraints().size()) {
        // write table-column-properties for columns with constraints
        m_tableFormatsWithColWidthConstraints.insert(formatIndex); // needed for linking of columns to styles
        for (int colit = 0; colit < format.columnWidthConstraints().size(); ++colit) {
            writer.writeStartElement(styleNS, QString::fromLatin1("style"));
            writer.writeAttribute(styleNS, QString::fromLatin1("name"),
                                  QString::fromLatin1("Table%1.%2").arg(formatIndex).arg(colit));
            writer.writeAttribute(styleNS, QString::fromLatin1("family"), QString::fromLatin1("table-column"));
            writer.writeEmptyElement(styleNS, QString::fromLatin1("table-column-properties"));
            QString columnWidth;
            if (format.columnWidthConstraints().at(colit).type() == QTextLength::PercentageLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "%"_L1;
            } else if (format.columnWidthConstraints().at(colit).type() == QTextLength::FixedLength) {
                columnWidth = QString::number(format.columnWidthConstraints().at(colit).rawValue())
                        + "pt"_L1;
            } else {
                //!! HARD-CODING variableWidth Constraints to 100% / nr constraints
                columnWidth = QString::number(100 / format.columnWidthConstraints().size())
                                      + "%"_L1;
            }
            writer.writeAttribute(styleNS, QString::fromLatin1("column-width"), columnWidth);
            writer.writeEndElement();
        }
    }
}